

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::ListNegativeInnerProductFun::GetFunctions(void)

{
  LogicalType varargs;
  LogicalType varargs_00;
  NotImplementedException *this;
  ScalarFunctionSet *in_RDI;
  pointer child;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd8c;
  FunctionNullHandling in_stack_fffffffffffffd98;
  bind_lambda_function_t in_stack_fffffffffffffda0;
  code *local_250 [2];
  code *local_240;
  code *local_238;
  vector<duckdb::ScalarFunction,_true> *local_230;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_228;
  undefined1 local_210 [48];
  LogicalType *local_1e0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1d8;
  string local_1c0;
  LogicalType local_1a0;
  LogicalType local_188;
  LogicalType list;
  ScalarFunction local_158;
  
  ::std::__cxx11::string::string
            ((string *)&local_1c0,"list_negative_inner_product",(allocator *)&local_158);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_1c0);
  ::std::__cxx11::string::~string((string *)&local_1c0);
  LogicalType::Real();
  local_1e0 = local_1d8.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_230 = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  child = local_1d8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          _M_impl.super__Vector_impl_data._M_start;
  do {
    if (child == local_1e0) {
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1d8);
      return in_RDI;
    }
    LogicalType::LIST(&list,child);
    if (child->id_ == DOUBLE) {
      LogicalType::LogicalType((LogicalType *)local_210,&list);
      LogicalType::LogicalType((LogicalType *)(local_210 + 0x18),&list);
      __l_00._M_len = 2;
      __l_00._M_array = (LogicalType *)local_210;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_228,__l_00,(allocator_type *)&stack0xfffffffffffffda7);
      LogicalType::LogicalType(&local_188,child);
      local_250[1] = (code *)0x0;
      local_250[0] = ListGenericFold<double,duckdb::NegativeInnerProductOp>;
      local_238 = ::std::
                  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  ::_M_invoke;
      local_240 = ::std::
                  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  ::_M_manager;
      LogicalType::LogicalType(&local_1a0,INVALID);
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs_00._0_8_ = &local_1a0;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffffd84;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffffd8c;
      ScalarFunction::ScalarFunction
                (&local_158,(vector<duckdb::LogicalType,_true> *)&local_228,&local_188,
                 (scalar_function_t *)local_250,(bind_scalar_function_t)0x0,
                 (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                 (init_local_state_t)0x0,varargs_00,CONSISTENT,in_stack_fffffffffffffd98,
                 in_stack_fffffffffffffda0);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&local_230->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_158);
      ScalarFunction::~ScalarFunction(&local_158);
      LogicalType::~LogicalType(&local_1a0);
      ::std::_Function_base::~_Function_base((_Function_base *)local_250);
      LogicalType::~LogicalType(&local_188);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_228);
      lVar1 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_210 + lVar1));
        lVar1 = lVar1 + -0x18;
      } while (lVar1 != -0x18);
    }
    else {
      if (child->id_ != FLOAT) {
        this = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_158,"List function not implemented for type %s",
                   (allocator *)local_250);
        LogicalType::ToString_abi_cxx11_((string *)local_210,child);
        NotImplementedException::NotImplementedException<std::__cxx11::string>
                  (this,(string *)&local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210);
        __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      }
      LogicalType::LogicalType((LogicalType *)local_210,&list);
      LogicalType::LogicalType((LogicalType *)(local_210 + 0x18),&list);
      __l._M_len = 2;
      __l._M_array = (LogicalType *)local_210;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_228,__l,(allocator_type *)&stack0xfffffffffffffda7);
      LogicalType::LogicalType(&local_188,child);
      local_250[1] = (code *)0x0;
      local_250[0] = ListGenericFold<float,duckdb::NegativeInnerProductOp>;
      local_238 = ::std::
                  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  ::_M_invoke;
      local_240 = ::std::
                  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  ::_M_manager;
      LogicalType::LogicalType(&local_1a0,INVALID);
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs._0_8_ = &local_1a0;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffffd84;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffffd8c;
      ScalarFunction::ScalarFunction
                (&local_158,(vector<duckdb::LogicalType,_true> *)&local_228,&local_188,
                 (scalar_function_t *)local_250,(bind_scalar_function_t)0x0,
                 (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                 (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffffd98,
                 in_stack_fffffffffffffda0);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&local_230->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_158);
      ScalarFunction::~ScalarFunction(&local_158);
      LogicalType::~LogicalType(&local_1a0);
      ::std::_Function_base::~_Function_base((_Function_base *)local_250);
      LogicalType::~LogicalType(&local_188);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_228);
      lVar1 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_210 + lVar1));
        lVar1 = lVar1 + -0x18;
      } while (lVar1 != -0x18);
    }
    LogicalType::~LogicalType(&list);
    child = child + 1;
  } while( true );
}

Assistant:

ScalarFunctionSet ListNegativeInnerProductFun::GetFunctions() {
	ScalarFunctionSet set("list_negative_inner_product");
	for (auto &type : LogicalType::Real()) {
		AddListFoldFunction<NegativeInnerProductOp>(set, type);
	}
	return set;
}